

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::mergeB(PtexSeparableKernel *this,BorderMode mode)

{
  int iVar1;
  float *p;
  long lVar2;
  float fVar3;
  
  iVar1 = this->v;
  lVar2 = -(long)iVar1;
  p = this->kv;
  if (mode != m_black) {
    fVar3 = accumulate(p,(int)lVar2);
    p = this->kv;
    lVar2 = (long)(int)lVar2;
    p[lVar2] = fVar3 + p[lVar2];
  }
  this->kv = p + lVar2;
  this->vw = this->vw + iVar1;
  this->v = 0;
  return;
}

Assistant:

void mergeB(BorderMode mode)
    {
        int w = -v;
        if (mode != m_black)
            kv[w] += accumulate(kv, w);
        kv += w;
        vw -= w;
        v = 0;
    }